

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O1

int If_CutMergeOrdered(If_Man_t *p,If_Cut_t *pC0,If_Cut_t *pC1,If_Cut_t *pC)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  uVar1 = *(uint *)&pC0->field_0x1c;
  uVar9 = uVar1 >> 0x18;
  uVar10 = *(uint *)&pC1->field_0x1c >> 0x18;
  uVar7 = uVar1 >> 0x10 & 0xff;
  if ((uVar9 == uVar7) && (uVar10 == uVar7)) {
    if (0xffffff < uVar1) {
      uVar6 = 0;
      do {
        if ((&pC0[1].Area)[uVar6] != (&pC1[1].Area)[uVar6]) {
          return 0;
        }
        (&pC[1].Area)[uVar6] = (&pC0[1].Area)[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar9 != uVar6);
    }
  }
  else {
    uVar5 = 0;
    uVar4 = 0;
    if (uVar1 < 0x1000000) {
LAB_008af9dc:
      if ((int)(uVar7 + uVar5) < (int)(uVar4 + uVar10)) {
        return 0;
      }
      uVar7 = uVar4;
      if ((int)uVar5 < (int)uVar10) {
        lVar8 = 0;
        do {
          (&pC[1].Area)[(int)uVar4 + lVar8] = (&pC1[1].Area)[(int)uVar5 + lVar8];
          lVar8 = lVar8 + 1;
        } while ((ulong)uVar10 - (long)(int)uVar5 != lVar8);
        uVar7 = uVar4 + (int)lVar8;
      }
    }
    else {
      uVar4 = 0;
      uVar5 = 0;
      if (0xffffff < *(uint *)&pC1->field_0x1c) {
        if (uVar7 != 0) {
          lVar8 = 0;
          uVar11 = 0;
          uVar4 = 0;
          do {
            fVar2 = (&pC0[1].Area)[(int)uVar4];
            fVar3 = (&pC1[1].Area)[(int)uVar11];
            if ((int)fVar2 < (int)fVar3) {
              uVar4 = uVar4 + 1;
              (&pC[1].Area)[lVar8] = fVar2;
              uVar5 = uVar11;
              if (uVar4 == uVar9) {
LAB_008afae8:
                uVar4 = (int)lVar8 + 1;
                goto LAB_008af9dc;
              }
            }
            else {
              if ((int)fVar3 < (int)fVar2) {
                (&pC[1].Area)[lVar8] = fVar3;
              }
              else {
                uVar4 = uVar4 + 1;
                (&pC[1].Area)[lVar8] = fVar2;
                uVar5 = uVar11 + 1;
                if (uVar4 == uVar9) goto LAB_008afae8;
              }
              uVar11 = uVar11 + 1;
              if (uVar11 == uVar10) {
                uVar5 = (int)lVar8 + 1;
                goto LAB_008afa38;
              }
            }
            lVar8 = lVar8 + 1;
          } while ((uVar1 >> 0x10 & 0xff) != (uint)lVar8);
        }
        return 0;
      }
LAB_008afa38:
      if ((int)(uVar7 + uVar4) < (int)(uVar5 + uVar9)) {
        return 0;
      }
      uVar7 = uVar5;
      if ((int)uVar4 < (int)uVar9) {
        lVar8 = 0;
        do {
          (&pC[1].Area)[(int)uVar5 + lVar8] = (&pC0[1].Area)[(int)uVar4 + lVar8];
          lVar8 = lVar8 + 1;
        } while ((ulong)uVar9 - (long)(int)uVar4 != lVar8);
        uVar7 = uVar5 + (int)lVar8;
      }
    }
  }
  pC->field_0x1f = (char)uVar7;
  pC->uSign = pC1->uSign | pC0->uSign;
  return 1;
}

Assistant:

int If_CutMergeOrdered( If_Man_t * p, If_Cut_t * pC0, If_Cut_t * pC1, If_Cut_t * pC )
{ 
    int nSizeC0 = pC0->nLeaves;
    int nSizeC1 = pC1->nLeaves;
    int nLimit  = pC0->nLimit;
    int i, k, c, s;

    // both cuts are the largest
    if ( nSizeC0 == nLimit && nSizeC1 == nLimit )
    {
        for ( i = 0; i < nSizeC0; i++ )
        {
            if ( pC0->pLeaves[i] != pC1->pLeaves[i] )
                return 0;
            pC->pLeaves[i] = pC0->pLeaves[i];
        }
        pC->nLeaves = nLimit;
        pC->uSign = pC0->uSign | pC1->uSign;
        return 1;
    }

    // compare two cuts with different numbers
    i = k = c = s = 0; 
    if ( nSizeC0 == 0 ) goto FlushCut1;
    if ( nSizeC1 == 0 ) goto FlushCut0;
    while ( 1 )
    {
        if ( c == nLimit ) return 0;
        if ( pC0->pLeaves[i] < pC1->pLeaves[k] )
        {
            pC->pLeaves[c++] = pC0->pLeaves[i++];
            if ( i == nSizeC0 ) goto FlushCut1;
        }
        else if ( pC0->pLeaves[i] > pC1->pLeaves[k] )
        {
            pC->pLeaves[c++] = pC1->pLeaves[k++];
            if ( k == nSizeC1 ) goto FlushCut0;
        }
        else
        {
            pC->pLeaves[c++] = pC0->pLeaves[i++]; k++;
            if ( i == nSizeC0 ) goto FlushCut1;
            if ( k == nSizeC1 ) goto FlushCut0;
        }
    }

FlushCut0:
    if ( c + nSizeC0 > nLimit + i ) return 0;
    while ( i < nSizeC0 )
        pC->pLeaves[c++] = pC0->pLeaves[i++];
    pC->nLeaves = c;
    pC->uSign = pC0->uSign | pC1->uSign;
    return 1;

FlushCut1:
    if ( c + nSizeC1 > nLimit + k ) return 0;
    while ( k < nSizeC1 )
        pC->pLeaves[c++] = pC1->pLeaves[k++];
    pC->nLeaves = c;
    pC->uSign = pC0->uSign | pC1->uSign;
    return 1;
}